

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,i64 n,u8 enc,_func_void_void_ptr *xDel)

{
  int iVar1;
  ushort uVar2;
  bool bVar3;
  int local_68;
  size_t local_50;
  i64 nAlloc;
  u16 flags;
  size_t sStack_40;
  int iLimit;
  i64 nByte;
  _func_void_void_ptr *xDel_local;
  u8 enc_local;
  i64 n_local;
  char *z_local;
  Mem *pMem_local;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    pMem_local._4_4_ = 0;
  }
  else {
    if (pMem->db == (sqlite3 *)0x0) {
      nAlloc._4_4_ = 1000000000;
    }
    else {
      nAlloc._4_4_ = pMem->db->aLimit[0];
    }
    xDel_local._7_1_ = enc;
    if (n < 0) {
      if (enc == '\x01') {
        sStack_40 = strlen(z);
      }
      else {
        sStack_40 = 0;
        while( true ) {
          bVar3 = false;
          if ((long)sStack_40 <= (long)nAlloc._4_4_) {
            bVar3 = z[sStack_40] != '\0' || z[sStack_40 + 1] != '\0';
          }
          if (!bVar3) break;
          sStack_40 = sStack_40 + 2;
        }
      }
      nAlloc._2_2_ = 0x202;
    }
    else {
      sStack_40 = n;
      if (enc == '\0') {
        nAlloc._2_2_ = 0x10;
        xDel_local._7_1_ = 1;
      }
      else {
        nAlloc._2_2_ = 2;
      }
    }
    if ((long)nAlloc._4_4_ < (long)sStack_40) {
      if ((xDel != (_func_void_void_ptr *)0x0) &&
         (xDel != (_func_void_void_ptr *)0xffffffffffffffff)) {
        if (xDel == sqlite3OomClear) {
          sqlite3DbFree(pMem->db,z);
        }
        else {
          (*xDel)(z);
        }
      }
      sqlite3VdbeMemSetNull(pMem);
      pMem_local._4_4_ = sqlite3ErrorToParser(pMem->db,0x12);
    }
    else {
      if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
        local_50 = sStack_40;
        if ((nAlloc._2_2_ & 0x200) != 0) {
          iVar1 = 2;
          if (xDel_local._7_1_ == 1) {
            iVar1 = 1;
          }
          local_50 = (long)iVar1 + sStack_40;
        }
        if ((long)local_50 < 0x21) {
          local_68 = 0x20;
        }
        else {
          local_68 = (int)local_50;
        }
        iVar1 = sqlite3VdbeMemClearAndResize(pMem,local_68);
        if (iVar1 != 0) {
          return 7;
        }
        memcpy(pMem->z,z,local_50);
      }
      else {
        sqlite3VdbeMemRelease(pMem);
        pMem->z = z;
        if (xDel == sqlite3OomClear) {
          pMem->zMalloc = pMem->z;
          iVar1 = sqlite3DbMallocSize(pMem->db,pMem->zMalloc);
          pMem->szMalloc = iVar1;
        }
        else {
          pMem->xDel = xDel;
          uVar2 = 0x1000;
          if (xDel == (_func_void_void_ptr *)0x0) {
            uVar2 = 0x2000;
          }
          nAlloc._2_2_ = nAlloc._2_2_ | uVar2;
        }
      }
      pMem->n = (uint)sStack_40 & 0x7fffffff;
      pMem->flags = nAlloc._2_2_;
      pMem->enc = xDel_local._7_1_;
      if ((xDel_local._7_1_ < 2) || (iVar1 = sqlite3VdbeMemHandleBom(pMem), iVar1 == 0)) {
        pMem_local._4_4_ = 0;
      }
      else {
        pMem_local._4_4_ = 7;
      }
    }
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  i64 n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  i64 nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags;          /* New value for pMem->flags */

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( enc!=0 || n>=0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags= MEM_Str|MEM_Term;
  }else if( enc==0 ){
    flags = MEM_Blob;
    enc = SQLITE_UTF8;
  }else{
    flags = MEM_Str;
  }
  if( nByte>iLimit ){
    if( xDel && xDel!=SQLITE_TRANSIENT ){
      if( xDel==SQLITE_DYNAMIC ){
        sqlite3DbFree(pMem->db, (void*)z);
      }else{
        xDel((void*)z);
      }
    }
    sqlite3VdbeMemSetNull(pMem);
    return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    i64 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = (int)(nByte & 0x7fffffff);
  pMem->flags = flags;
  pMem->enc = enc;

#ifndef SQLITE_OMIT_UTF16
  if( enc>SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif


  return SQLITE_OK;
}